

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O2

void __thiscall
Node::OutputDefinitionList(Node *this,ostream *os,Node *MainType,int ExtType,int GlobalStat)

{
  VARTYPE Type;
  ostream *poVar1;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int iVar2;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  char *pcVar3;
  Node *loop;
  Node *pNVar4;
  string local_78;
  Node *local_58;
  string local_50;
  
  local_58 = MainType;
  while (iVar2 = this->Type, iVar2 == 0x124) {
    OutputDefinitionList(this->Tree[0],os,local_58,ExtType,GlobalStat);
    this = this->Block[0];
    if (this == (Node *)0x0) {
      return;
    }
  }
  if ((iVar2 - 0x1fdU < 2) || (iVar2 == 0x1d9)) {
    Indent_abi_cxx11_(&local_78,this);
    std::operator<<(os,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    iVar2 = extraout_EDX;
    if (GlobalStat == 2) {
      std::operator<<(os,"extern ");
      iVar2 = extraout_EDX_00;
    }
    if (this->Tree[1] != (Node *)0x0) {
      OutputNodeVarType_abi_cxx11_(&local_78,this->Tree[1]);
      poVar1 = std::operator<<(os,(string *)&local_78);
      std::operator<<(poVar1," ");
      std::__cxx11::string::~string((string *)&local_78);
      iVar2 = extraout_EDX_01;
    }
    if (this->Tree[3] != (Node *)0x0) {
      OutputPassmech_abi_cxx11_(&local_78,this->Tree[3],iVar2);
      std::operator<<(os,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
    }
    OutputVarName_abi_cxx11_(&local_78,this->Tree[0],this->Tree[2],1);
    std::operator<<(os,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    if (this->Tree[4] != (Node *)0x0) {
      std::operator<<(os," = ");
      OutputCodeOne(this->Tree[4],os);
    }
  }
  else {
    if (iVar2 == 0x18a) {
      Indent_abi_cxx11_(&local_78,this);
      std::operator<<(os,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      OutputRemark(this,os);
      goto LAB_00112618;
    }
    if (iVar2 == 0x1b4) {
      Indent_abi_cxx11_(&local_78,this);
      poVar1 = std::operator<<(os,(string *)&local_78);
      poVar1 = std::operator<<(poVar1,"union");
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      Indent_abi_cxx11_(&local_50,this);
      poVar1 = std::operator<<(poVar1,(string *)&local_50);
      poVar1 = std::operator<<(poVar1,"{");
      std::endl<char,std::char_traits<char>>(poVar1);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_78);
      Level = Level + 1;
      OutputDefinitionList(this->Block[1],os,local_58,ExtType,GlobalStat);
      Level = Level + -1;
      Indent_abi_cxx11_(&local_78,this);
      poVar1 = std::operator<<(os,(string *)&local_78);
      poVar1 = std::operator<<(poVar1,"};");
      std::endl<char,std::char_traits<char>>(poVar1);
LAB_0011246c:
      std::__cxx11::string::~string((string *)&local_78);
      return;
    }
    if (iVar2 != 0x1d8) {
      if (iVar2 == 0x112) {
        for (pNVar4 = this; pNVar4 != (Node *)0x0; pNVar4 = pNVar4->Block[0]) {
          Indent_abi_cxx11_(&local_78,this);
          poVar1 = std::operator<<(os,(string *)&local_78);
          poVar1 = std::operator<<(poVar1,"struct");
          poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
          Indent_abi_cxx11_(&local_50,this);
          poVar1 = std::operator<<(poVar1,(string *)&local_50);
          poVar1 = std::operator<<(poVar1,"{");
          std::endl<char,std::char_traits<char>>(poVar1);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_78);
          Level = Level + 1;
          OutputDefinitionList(pNVar4->Block[1],os,local_58,ExtType,GlobalStat);
          Level = Level + -1;
          Indent_abi_cxx11_(&local_78,this);
          poVar1 = std::operator<<(os,(string *)&local_78);
          poVar1 = std::operator<<(poVar1,"};");
          std::endl<char,std::char_traits<char>>(poVar1);
          std::__cxx11::string::~string((string *)&local_78);
        }
        return;
      }
      Indent_abi_cxx11_(&local_78,this);
      poVar1 = std::operator<<(os,(string *)&local_78);
      OutputDefinition_abi_cxx11_(&local_50,this,local_58,ExtType);
      poVar1 = std::operator<<(poVar1,(string *)&local_50);
      poVar1 = std::operator<<(poVar1,";");
      std::endl<char,std::char_traits<char>>(poVar1);
      std::__cxx11::string::~string((string *)&local_50);
      goto LAB_0011246c;
    }
    Indent_abi_cxx11_(&local_78,this);
    std::operator<<(os,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    if (GlobalStat == 1) {
      pcVar3 = "const ";
LAB_0011248b:
      std::operator<<(os,pcVar3);
      iVar2 = extraout_EDX_03;
    }
    else {
      if (GlobalStat == 3) {
        pcVar3 = "extern const ";
        goto LAB_0011248b;
      }
      iVar2 = extraout_EDX_02;
      if (GlobalStat == 4) {
        pcVar3 = "extern ";
        goto LAB_0011248b;
      }
    }
    if (this->Tree[2] == (Node *)0x0) {
      if (this->Tree[1] != (Node *)0x0) {
        OutputNodeVarType_abi_cxx11_(&local_78,this->Tree[1]);
        poVar1 = std::operator<<(os,(string *)&local_78);
        std::operator<<(poVar1," ");
        std::__cxx11::string::~string((string *)&local_78);
        iVar2 = extraout_EDX_04;
      }
      if (this->Tree[3] != (Node *)0x0) {
        OutputPassmech_abi_cxx11_(&local_78,this->Tree[3],iVar2);
        std::operator<<(os,(string *)&local_78);
        std::__cxx11::string::~string((string *)&local_78);
      }
      if (this->Tree[0] != (Node *)0x0) {
        OutputVarName_abi_cxx11_(&local_78,this->Tree[0],this->Tree[2],1);
        std::operator<<(os,(string *)&local_78);
        std::__cxx11::string::~string((string *)&local_78);
      }
      if (this->Tree[4] == (Node *)0x0) {
        pNVar4 = this->Tree[2];
        Type = GetNodeVarType(this->Tree[1]);
        OutputVarInit_abi_cxx11_(&local_78,(uint)(pNVar4 != (Node *)0x0),Type);
        std::operator<<(os,(string *)&local_78);
      }
      else {
        poVar1 = std::operator<<(os," = ");
        Expression_abi_cxx11_(&local_78,this->Tree[4]);
        std::operator<<(poVar1,(string *)&local_78);
      }
    }
    else {
      OutputArrayDef_abi_cxx11_(&local_78,this->Tree[2],this);
      poVar1 = std::operator<<(os,(string *)&local_78);
      poVar1 = std::operator<<(poVar1," ");
      OutputVarName_abi_cxx11_(&local_50,this->Tree[0],this->Tree[2],3);
      std::operator<<(poVar1,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::__cxx11::string::~string((string *)&local_78);
  }
  poVar1 = std::operator<<(os,";");
  std::endl<char,std::char_traits<char>>(poVar1);
LAB_00112618:
  if (this->Block[0] == (Node *)0x0) {
    return;
  }
  OutputDefinitionList(this->Block[0],os,local_58,ExtType,GlobalStat);
  return;
}

Assistant:

void Node::OutputDefinitionList(
	std::ostream& os,	/**< iostream to write C++ code to */
	Node* MainType,		/**< main data type */
	int ExtType,		/**< extended data type */
	int GlobalStat		/**< global status */
)
{
	switch(Type)
	{
	case BAS_S_DECLARE:
		Tree[0]->OutputDefinitionList(os,
			MainType, ExtType, GlobalStat);
		if (Block[0] != 0)
		{
			Block[0]->OutputDefinitionList(os,
				MainType, ExtType, GlobalStat);
		}
		break;

	case BAS_V_DEFINEVAR:
		os << Indent();

		switch(GlobalStat)
		{
		case 1:		// Constant definition
			os << "const ";
			break;

		case 3:		// External constant
			os << "extern const ";
			break;

		case 4:		// External
			os << "extern ";
			break;
		}

		//
		// We have an array
		//
		if (Tree[2] != 0)
		{
			os << Tree[2]->OutputArrayDef(this) << " " <<
				Tree[0]->OutputVarName(Tree[2], 1 + 2);
		}
		else
		{
			if (Tree[1] != 0)
			{
				os << Tree[1]->OutputNodeVarType() << " ";
			}
			if (Tree[3] != 0)
			{
				os << Tree[3]->OutputPassmech(0);
			}
			if (Tree[0] != 0)
			{
				os << Tree[0]->OutputVarName(Tree[2], 1);
			}
			if (Tree[4] != 0)
			{
				os << " = " << Tree[4]->Expression();
			}
			else
			{
				os << OutputVarInit(
					Tree[2] != 0,
					Tree[1]->GetNodeVarType());
			}
		}

		os << ";" << std::endl;

//
// For these definitions, a downlink points to the next variable 
// not to internal structures of this variable.
// So, is this needed by anything?
// 
// This is apparently used by DIM statements when multu=iplw variables
// are dimensioned.
//
		if (Block[0] != 0)
		{
			Block[0]->OutputDefinitionList(os, MainType, ExtType, GlobalStat);
		}
		break;

	case BAS_V_DEFINEFUN:
	case BAS_N_EXTERNALFUNCTION:
	case BAS_N_EXTERNALSUB:
		os << Indent();

		switch(GlobalStat)
		{
		case 2:		// Constant definition
			os << "extern ";
			break;
		}

		if (Tree[1] != 0)
		{
			os << Tree[1]->OutputNodeVarType() << " ";
		}
		if (Tree[3] != 0)
		{
			os << Tree[3]->OutputPassmech(1);
		}
		os << Tree[0]->OutputVarName(Tree[2], 1);
		if (Tree[4] != 0)
		{
			os << " = ";
			Tree[4]->OutputCodeOne(os);
		}
		os << ";" << std::endl;
		if (Block[0] != 0)
		{
			Block[0]->OutputDefinitionList(os, MainType, ExtType, GlobalStat);
		}
		break;

	case BAS_S_VARIANT:

		os << Indent() << "union" << std::endl <<
			Indent() << "{" << std::endl;
		Level++;
		Block[1]->OutputDefinitionList(os, MainType, ExtType, GlobalStat);
		Level--;
		os << Indent() << "};" << std::endl;

		break;

	case BAS_S_CASE:
		//
		// Variant case
		//
		for (Node* loop = this; loop != 0; loop = loop->Block[0])
		{
			os << Indent() << "struct" << std::endl <<
				Indent() << "{" << std::endl;
			Level++;
			loop->Block[1]->OutputDefinitionList(os, MainType, ExtType,
				GlobalStat);
			Level--;
			os << Indent() << "};" << std::endl;
		}

		break;


	case BAS_S_REMARK:
		os << Indent();
		OutputRemark(os);
		if (Block[0] != 0)
		{
			Block[0]->OutputDefinitionList(os, MainType, ExtType, GlobalStat);
		}
		break;

	default:
		os << Indent() << OutputDefinition(MainType, ExtType) << ";" << std::endl;
		break;
	}
}